

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

Abc_Cex_t * Abc_CexMerge(Abc_Cex_t *pCex,Abc_Cex_t *pPart,int iFrBeg,int iFrEnd)

{
  int iVar1;
  int local_40;
  int local_3c;
  int iBit;
  int f;
  int i;
  int nFramesGain;
  Abc_Cex_t *pNew;
  int iFrEnd_local;
  int iFrBeg_local;
  Abc_Cex_t *pPart_local;
  Abc_Cex_t *pCex_local;
  
  if (iFrBeg < 0) {
    printf("Starting frame is less than 0.\n");
    pCex_local = (Abc_Cex_t *)0x0;
  }
  else if (iFrEnd < 0) {
    printf("Stopping frame is less than 0.\n");
    pCex_local = (Abc_Cex_t *)0x0;
  }
  else if (pCex->iFrame < iFrBeg) {
    printf("Starting frame is more than the last frame of CEX (%d).\n",(ulong)(uint)pCex->iFrame);
    pCex_local = (Abc_Cex_t *)0x0;
  }
  else if (pCex->iFrame < iFrEnd) {
    printf("Stopping frame is more than the last frame of CEX (%d).\n",(ulong)(uint)pCex->iFrame);
    pCex_local = (Abc_Cex_t *)0x0;
  }
  else if (iFrEnd < iFrBeg) {
    printf("Starting frame (%d) should be less than stopping frame (%d).\n",(ulong)(uint)iFrBeg,
           (ulong)(uint)iFrEnd);
    pCex_local = (Abc_Cex_t *)0x0;
  }
  else {
    if ((iFrBeg < 0) || (pCex->iFrame < iFrBeg)) {
      __assert_fail("iFrBeg >= 0 && iFrBeg <= pCex->iFrame",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                    ,0xd5,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
    }
    if ((iFrEnd < 0) || (pCex->iFrame < iFrEnd)) {
      __assert_fail("iFrEnd >= 0 && iFrEnd <= pCex->iFrame",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                    ,0xd6,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
    }
    if (iFrEnd < iFrBeg) {
      __assert_fail("iFrBeg <= iFrEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                    ,0xd7,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
    }
    if (pCex->nPis != pPart->nPis) {
      __assert_fail("pCex->nPis == pPart->nPis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                    ,0xd9,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
    }
    if ((iFrEnd - iFrBeg) + pPart->iPo < pPart->iFrame) {
      __assert_fail("iFrEnd - iFrBeg + pPart->iPo >= pPart->iFrame",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                    ,0xda,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
    }
    iVar1 = ((iFrEnd - iFrBeg) + pPart->iPo) - pPart->iFrame;
    pCex_local = Abc_CexAlloc(pCex->nRegs,pCex->nPis,(pCex->iFrame + 1) - iVar1);
    pCex_local->iPo = pCex->iPo;
    pCex_local->iFrame = pCex->iFrame - iVar1;
    for (local_40 = 0; local_40 < pCex->nRegs; local_40 = local_40 + 1) {
      iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),local_40);
      if (iVar1 != 0) {
        Abc_InfoSetBit((uint *)(pCex_local + 1),local_40);
      }
    }
    for (local_3c = 0; local_3c < iFrBeg; local_3c = local_3c + 1) {
      for (iBit = 0; iBit < pCex->nPis; iBit = iBit + 1) {
        iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),pCex->nRegs + pCex->nPis * local_3c + iBit);
        if (iVar1 != 0) {
          Abc_InfoSetBit((uint *)(pCex_local + 1),local_40);
        }
        local_40 = local_40 + 1;
      }
    }
    for (local_3c = 0; iVar1 = iFrEnd, local_3c < pPart->iFrame; local_3c = local_3c + 1) {
      for (iBit = 0; iBit < pCex->nPis; iBit = iBit + 1) {
        iVar1 = Abc_InfoHasBit((uint *)(pPart + 1),pPart->nRegs + pCex->nPis * local_3c + iBit);
        if (iVar1 != 0) {
          Abc_InfoSetBit((uint *)(pCex_local + 1),local_40);
        }
        local_40 = local_40 + 1;
      }
    }
    while (local_3c = iVar1, local_3c <= pCex->iFrame) {
      for (iBit = 0; iBit < pCex->nPis; iBit = iBit + 1) {
        iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),pCex->nRegs + pCex->nPis * local_3c + iBit);
        if (iVar1 != 0) {
          Abc_InfoSetBit((uint *)(pCex_local + 1),local_40);
        }
        local_40 = local_40 + 1;
      }
      iVar1 = local_3c + 1;
    }
    if (local_40 != pCex_local->nBits) {
      __assert_fail("iBit == pNew->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                    ,0xf0,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
    }
  }
  return pCex_local;
}

Assistant:

Abc_Cex_t * Abc_CexMerge( Abc_Cex_t * pCex, Abc_Cex_t * pPart, int iFrBeg, int iFrEnd )
{
    Abc_Cex_t * pNew;
    int nFramesGain;
    int i, f, iBit;

    if ( iFrBeg < 0 )
        { printf( "Starting frame is less than 0.\n" ); return NULL; }
    if ( iFrEnd < 0 )
        { printf( "Stopping frame is less than 0.\n" ); return NULL; }
    if ( iFrBeg > pCex->iFrame )
        { printf( "Starting frame is more than the last frame of CEX (%d).\n", pCex->iFrame ); return NULL; }
    if ( iFrEnd > pCex->iFrame )
        { printf( "Stopping frame is more than the last frame of CEX (%d).\n", pCex->iFrame ); return NULL; }
    if ( iFrBeg > iFrEnd )
        { printf( "Starting frame (%d) should be less than stopping frame (%d).\n", iFrBeg, iFrEnd ); return NULL; }
    assert( iFrBeg >= 0 && iFrBeg <= pCex->iFrame );
    assert( iFrEnd >= 0 && iFrEnd <= pCex->iFrame );
    assert( iFrBeg <= iFrEnd );

    assert( pCex->nPis == pPart->nPis );
    assert( iFrEnd - iFrBeg + pPart->iPo >= pPart->iFrame );

    nFramesGain = iFrEnd - iFrBeg + pPart->iPo - pPart->iFrame;
    pNew = Abc_CexAlloc( pCex->nRegs, pCex->nPis, pCex->iFrame + 1 - nFramesGain );
    pNew->iPo    = pCex->iPo;
    pNew->iFrame = pCex->iFrame - nFramesGain;

    for ( iBit = 0; iBit < pCex->nRegs; iBit++ )
        if ( Abc_InfoHasBit(pCex->pData, iBit) )
            Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = 0; f < iFrBeg; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = 0; f < pPart->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pPart->pData, pPart->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = iFrEnd; f <= pCex->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    assert( iBit == pNew->nBits );

    return pNew;
}